

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::insert<kj::StringPtr,kj::StringPtr>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,size_t pos,StringPtr *params)

{
  int iVar1;
  long lVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  undefined8 *in_R9;
  ulong uVar3;
  ulong uVar4;
  Maybe<unsigned_long> MVar5;
  Iterator iter;
  Iterator local_70;
  size_t local_58;
  size_t local_50;
  SearchKey local_48;
  StringPtr *local_40;
  size_t *local_38;
  
  local_58 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236940;
  local_50 = pos;
  _::BTreeImpl::insert(&local_70,(BTreeImpl *)&(local_40->content).size_,&local_48);
  uVar3 = (ulong)local_70.row;
  if ((uVar3 != 0xe) && ((local_70.leaf)->rows[uVar3].i != 0)) {
    uVar4 = (ulong)((local_70.leaf)->rows[uVar3].i - 1);
    lVar2 = uVar4 * 0x10;
    __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(local_58 + 8 + lVar2))->
          value;
    if (__n.value == in_R9[1]) {
      if (__n.value != 0) {
        iVar1 = bcmp(*(void **)(local_58 + lVar2),(void *)*in_R9,__n.value);
        __n = extraout_RDX;
        if (iVar1 != 0) goto LAB_0016a6bd;
      }
      *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1;
      *(ulong *)(this + 8) = uVar4;
      goto LAB_0016a6f3;
    }
  }
LAB_0016a6bd:
  memmove((local_70.leaf)->rows + uVar3 + 1,(local_70.leaf)->rows + uVar3,
          (ulong)(local_70.row + 1) * -4 + 0x38);
  (local_70.leaf)->rows[uVar3].i = (int)params + 1;
  *this = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x0;
  __n = extraout_RDX_00;
LAB_0016a6f3:
  MVar5.ptr.field_1.value = __n.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar5.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }